

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m128i *palVar1;
  int iVar2;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar3;
  ulong uVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  __m128i *palVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined2 uVar14;
  size_t size;
  bool bVar15;
  __m128i extraout_XMM0;
  __m128i alVar16;
  undefined1 auVar17 [16];
  __m128i_16_t in_XMM1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar33 [16];
  ushort uVar40;
  ushort uVar41;
  short sVar42;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar43 [16];
  short sVar51;
  short sVar52;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  int local_b0;
  __m128i_16_t t;
  size_t local_90;
  parasail_result_t *local_88;
  char *local_80;
  ulong local_78;
  char *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  __m128i_16_t e;
  
  local_78 = CONCAT44(in_register_0000000c,s2Len);
  uVar5 = (long)(s1Len + 7) / 8;
  iVar11 = (int)uVar5;
  local_80 = s2;
  local_70 = s1;
  ptr = parasail_memalign___m128i(0x10,(long)(iVar11 * 0x18));
  size = (size_t)iVar11;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  local_68 = ZEXT416((uint)open);
  local_58 = ZEXT416((uint)gap);
  ppVar3 = parasail_result_new();
  uVar4 = 0;
  if (0 < iVar11) {
    uVar4 = uVar5 & 0xffffffff;
  }
  alVar16 = extraout_XMM0;
  iVar11 = 0;
  for (iVar2 = 0; local_b0 = (int)uVar4, iVar2 != 0x18; iVar2 = iVar2 + 1) {
    lVar12 = 0;
    pcVar10 = local_70;
    for (lVar7 = (long)iVar11; lVar7 != local_b0 + iVar11; lVar7 = lVar7 + 1) {
      for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
        if (lVar12 + lVar13 < (long)s1Len) {
          uVar14 = (undefined2)
                   matrix->matrix[(long)matrix->mapper[(byte)pcVar10[lVar13]] * (long)matrix->size];
        }
        else {
          uVar14 = 0;
        }
        *(undefined2 *)((long)&t + lVar13 * 2) = uVar14;
      }
      alVar16[1] = t.m[1];
      alVar16[0] = t.m[0];
      ptr[lVar7] = alVar16;
      lVar12 = lVar12 + 8;
      pcVar10 = pcVar10 + 8;
    }
    iVar11 = local_b0 + iVar11;
  }
  auVar17 = pshuflw((undefined1  [16])alVar16,local_68,0);
  iVar11 = 8;
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      *(undefined2 *)((long)&t + lVar7 * 2) = 0;
      *(short *)((long)&e + lVar7 * 2) = -(short)open;
    }
    ptr_00[uVar5][0] = t.m[0];
    ptr_00[uVar5][1] = t.m[1];
    *(__m128i_16_t *)(ptr_01 + uVar5) = e;
    in_XMM1 = e;
  }
  auVar18 = pshuflw((undefined1  [16])in_XMM1,local_58,0);
  uVar6 = 0;
  uVar5 = local_78 & 0xffffffff;
  if ((int)local_78 < 1) {
    uVar5 = uVar6;
  }
  sVar20 = auVar18._0_2_;
  sVar22 = auVar17._0_2_;
  sVar21 = auVar18._2_2_;
  sVar23 = auVar17._2_2_;
  auVar17 = (undefined1  [16])0x0;
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    iVar2 = matrix->mapper[(byte)local_80[uVar6]];
    auVar18 = (undefined1  [16])0x0;
    uVar41 = 0xc000;
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      alVar16 = ptr_00[uVar8];
      palVar1 = ptr_01 + uVar8;
      sVar24 = (short)(*palVar1)[0];
      sVar25 = *(short *)((long)*palVar1 + 2);
      sVar26 = *(short *)((long)*palVar1 + 4);
      sVar27 = *(short *)((long)*palVar1 + 6);
      sVar28 = (short)(*palVar1)[1];
      sVar29 = *(short *)((long)*palVar1 + 10);
      sVar30 = *(short *)((long)*palVar1 + 0xc);
      sVar31 = *(short *)((long)*palVar1 + 0xe);
      auVar33._0_8_ = alVar16[0] << 0x10;
      auVar33._8_8_ = alVar16[1] << 0x10 | alVar16[0] >> 0x30;
      auVar18 = auVar18 | auVar33;
      palVar1 = ptr + (long)iVar2 * size + uVar8;
      sVar42 = auVar18._0_2_ + (short)(*palVar1)[0];
      sVar44 = auVar18._2_2_ + *(short *)((long)*palVar1 + 2);
      sVar45 = auVar18._4_2_ + *(short *)((long)*palVar1 + 4);
      sVar46 = auVar18._6_2_ + *(short *)((long)*palVar1 + 6);
      sVar47 = auVar18._8_2_ + (short)(*palVar1)[1];
      sVar48 = auVar18._10_2_ + *(short *)((long)*palVar1 + 10);
      sVar49 = auVar18._12_2_ + *(short *)((long)*palVar1 + 0xc);
      sVar50 = auVar18._14_2_ + *(short *)((long)*palVar1 + 0xe);
      sVar58 = (ushort)(-1 < sVar24) * sVar24;
      sVar52 = (ushort)(-1 < sVar25) * sVar25;
      sVar59 = (ushort)(-1 < sVar26) * sVar26;
      sVar60 = (ushort)(-1 < sVar27) * sVar27;
      sVar51 = (ushort)(-1 < sVar28) * sVar28;
      sVar56 = (ushort)(-1 < sVar29) * sVar29;
      sVar57 = (ushort)(-1 < sVar30) * sVar30;
      sVar55 = (ushort)(-1 < sVar31) * sVar31;
      uVar32 = (ushort)(sVar58 < sVar42) * sVar42 | (ushort)(sVar58 >= sVar42) * sVar58;
      uVar34 = (ushort)(sVar52 < sVar44) * sVar44 | (ushort)(sVar52 >= sVar44) * sVar52;
      uVar35 = (ushort)(sVar59 < sVar45) * sVar45 | (ushort)(sVar59 >= sVar45) * sVar59;
      uVar36 = (ushort)(sVar60 < sVar46) * sVar46 | (ushort)(sVar60 >= sVar46) * sVar60;
      uVar37 = (ushort)(sVar51 < sVar47) * sVar47 | (ushort)(sVar51 >= sVar47) * sVar51;
      uVar38 = (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
      uVar39 = (ushort)(sVar57 < sVar49) * sVar49 | (ushort)(sVar57 >= sVar49) * sVar57;
      uVar40 = (ushort)(sVar55 < sVar50) * sVar50 | (ushort)(sVar55 >= sVar50) * sVar55;
      auVar43._0_2_ = uVar41 - sVar22;
      auVar43._2_2_ = uVar32 - sVar23;
      auVar43._4_2_ = uVar34 - sVar22;
      auVar43._6_2_ = uVar35 - sVar23;
      auVar43._8_2_ = uVar36 - sVar22;
      auVar43._10_2_ = uVar37 - sVar23;
      auVar43._12_2_ = uVar38 - sVar22;
      auVar43._14_2_ = uVar39 - sVar23;
      auVar53._0_2_ = -(ushort)(0 < (short)auVar43._0_2_);
      auVar53._2_2_ = -(ushort)(0 < (short)auVar43._2_2_);
      auVar53._4_2_ = -(ushort)(0 < (short)auVar43._4_2_);
      auVar53._6_2_ = -(ushort)(0 < (short)auVar43._6_2_);
      auVar53._8_2_ = -(ushort)(0 < (short)auVar43._8_2_);
      auVar53._10_2_ = -(ushort)(0 < (short)auVar43._10_2_);
      auVar53._12_2_ = -(ushort)(0 < (short)auVar43._12_2_);
      auVar53._14_2_ = -(ushort)(0 < (short)auVar43._14_2_);
      auVar18 = auVar43;
      uVar41 = uVar40;
      if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar53 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar53 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar53 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar53 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar53 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar53 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53._14_2_ >> 7 & 1) != 0) || (auVar53._14_2_ & 0x8000) != 0) {
        while( true ) {
          auVar61._0_2_ = -(ushort)(0 < auVar18._0_2_);
          auVar61._2_2_ = -(ushort)(0 < auVar18._2_2_);
          auVar61._4_2_ = -(ushort)(0 < auVar18._4_2_);
          auVar61._6_2_ = -(ushort)(0 < auVar18._6_2_);
          auVar61._8_2_ = -(ushort)(0 < auVar18._8_2_);
          auVar61._10_2_ = -(ushort)(0 < auVar18._10_2_);
          auVar61._12_2_ = -(ushort)(0 < auVar18._12_2_);
          auVar61._14_2_ = -(ushort)(0 < auVar18._14_2_);
          sVar52 = auVar43._0_2_;
          sVar55 = auVar43._2_2_;
          sVar56 = auVar43._4_2_;
          sVar57 = auVar43._6_2_;
          sVar58 = auVar43._8_2_;
          sVar59 = auVar43._10_2_;
          sVar60 = auVar43._12_2_;
          sVar51 = auVar43._14_2_;
          if ((((((((((((((((auVar61 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar61 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar61 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar61 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar61 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar61 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar61 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar61 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar61 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar61 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar61 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar61._14_2_ >> 7 & 1) == 0) && (auVar61._14_2_ & 0x8000) == 0) break;
          sVar42 = -sVar20;
          auVar54._2_2_ = auVar18._0_2_ - sVar21;
          auVar54._0_2_ = sVar42;
          auVar54._4_2_ = auVar18._2_2_ - sVar20;
          auVar54._6_2_ = auVar18._4_2_ - sVar21;
          auVar54._8_2_ = auVar18._6_2_ - sVar20;
          auVar54._10_2_ = auVar18._8_2_ - sVar21;
          auVar54._12_2_ = auVar18._10_2_ - sVar20;
          auVar54._14_2_ = auVar18._12_2_ - sVar21;
          auVar43._0_2_ = (ushort)(sVar52 < sVar42) * sVar42 | (ushort)(sVar52 >= sVar42) * sVar52;
          auVar43._2_2_ =
               (ushort)(sVar55 < auVar54._2_2_) * auVar54._2_2_ |
               (ushort)(sVar55 >= auVar54._2_2_) * sVar55;
          auVar43._4_2_ =
               (ushort)(sVar56 < auVar54._4_2_) * auVar54._4_2_ |
               (ushort)(sVar56 >= auVar54._4_2_) * sVar56;
          auVar43._6_2_ =
               (ushort)(sVar57 < auVar54._6_2_) * auVar54._6_2_ |
               (ushort)(sVar57 >= auVar54._6_2_) * sVar57;
          auVar43._8_2_ =
               (ushort)(sVar58 < auVar54._8_2_) * auVar54._8_2_ |
               (ushort)(sVar58 >= auVar54._8_2_) * sVar58;
          auVar43._10_2_ =
               (ushort)(sVar59 < auVar54._10_2_) * auVar54._10_2_ |
               (ushort)(sVar59 >= auVar54._10_2_) * sVar59;
          auVar43._12_2_ =
               (ushort)(sVar60 < auVar54._12_2_) * auVar54._12_2_ |
               (ushort)(sVar60 >= auVar54._12_2_) * sVar60;
          auVar43._14_2_ =
               (ushort)(sVar51 < auVar54._14_2_) * auVar54._14_2_ |
               (ushort)(sVar51 >= auVar54._14_2_) * sVar51;
          auVar18 = auVar54;
        }
        uVar32 = (ushort)((short)uVar32 < sVar52) * sVar52 | ((short)uVar32 >= sVar52) * uVar32;
        uVar34 = (ushort)((short)uVar34 < sVar55) * sVar55 | ((short)uVar34 >= sVar55) * uVar34;
        uVar35 = (ushort)((short)uVar35 < sVar56) * sVar56 | ((short)uVar35 >= sVar56) * uVar35;
        uVar36 = (ushort)((short)uVar36 < sVar57) * sVar57 | ((short)uVar36 >= sVar57) * uVar36;
        uVar37 = (ushort)((short)uVar37 < sVar58) * sVar58 | ((short)uVar37 >= sVar58) * uVar37;
        uVar38 = (ushort)((short)uVar38 < sVar59) * sVar59 | ((short)uVar38 >= sVar59) * uVar38;
        uVar39 = (ushort)((short)uVar39 < sVar60) * sVar60 | ((short)uVar39 >= sVar60) * uVar39;
        uVar40 = (ushort)((short)uVar40 < sVar51) * sVar51 | ((short)uVar40 >= sVar51) * uVar40;
        sVar51 = sVar51 + (sVar23 - sVar21);
        uVar41 = (sVar51 < (short)uVar40) * uVar40 | (ushort)(sVar51 >= (short)uVar40) * sVar51;
      }
      palVar1 = ptr_00 + uVar8;
      palVar9 = ptr_01 + uVar8;
      auVar18 = (undefined1  [16])alVar16 >> 0x70;
      *(ushort *)*palVar1 = uVar32;
      *(ushort *)((long)*palVar1 + 2) = uVar34;
      *(ushort *)((long)*palVar1 + 4) = uVar35;
      *(ushort *)((long)*palVar1 + 6) = uVar36;
      *(ushort *)(*palVar1 + 1) = uVar37;
      *(ushort *)((long)*palVar1 + 10) = uVar38;
      *(ushort *)((long)*palVar1 + 0xc) = uVar39;
      *(ushort *)((long)*palVar1 + 0xe) = uVar40;
      sVar52 = auVar17._0_2_;
      auVar19._0_2_ = (sVar52 < (short)uVar32) * uVar32 | (ushort)(sVar52 >= (short)uVar32) * sVar52
      ;
      sVar52 = auVar17._2_2_;
      auVar19._2_2_ = (sVar52 < (short)uVar34) * uVar34 | (ushort)(sVar52 >= (short)uVar34) * sVar52
      ;
      sVar52 = auVar17._4_2_;
      auVar19._4_2_ = (sVar52 < (short)uVar35) * uVar35 | (ushort)(sVar52 >= (short)uVar35) * sVar52
      ;
      sVar52 = auVar17._6_2_;
      auVar19._6_2_ = (sVar52 < (short)uVar36) * uVar36 | (ushort)(sVar52 >= (short)uVar36) * sVar52
      ;
      sVar52 = auVar17._8_2_;
      auVar19._8_2_ = (sVar52 < (short)uVar37) * uVar37 | (ushort)(sVar52 >= (short)uVar37) * sVar52
      ;
      sVar52 = auVar17._10_2_;
      auVar19._10_2_ =
           (sVar52 < (short)uVar38) * uVar38 | (ushort)(sVar52 >= (short)uVar38) * sVar52;
      sVar52 = auVar17._12_2_;
      sVar55 = auVar17._14_2_;
      auVar19._12_2_ =
           (sVar52 < (short)uVar39) * uVar39 | (ushort)(sVar52 >= (short)uVar39) * sVar52;
      auVar19._14_2_ =
           (sVar55 < (short)uVar40) * uVar40 | (ushort)(sVar55 >= (short)uVar40) * sVar55;
      sVar52 = uVar32 - sVar22;
      sVar55 = uVar34 - sVar23;
      sVar56 = uVar35 - sVar22;
      sVar57 = uVar36 - sVar23;
      sVar58 = uVar37 - sVar22;
      sVar59 = uVar38 - sVar23;
      sVar60 = uVar39 - sVar22;
      sVar51 = uVar40 - sVar23;
      sVar24 = sVar24 - sVar20;
      sVar25 = sVar25 - sVar21;
      sVar26 = sVar26 - sVar20;
      sVar27 = sVar27 - sVar21;
      sVar28 = sVar28 - sVar20;
      sVar29 = sVar29 - sVar21;
      sVar30 = sVar30 - sVar20;
      sVar31 = sVar31 - sVar21;
      *(ushort *)*palVar9 = (ushort)(sVar24 < sVar52) * sVar52 | (ushort)(sVar24 >= sVar52) * sVar24
      ;
      *(ushort *)((long)*palVar9 + 2) =
           (ushort)(sVar25 < sVar55) * sVar55 | (ushort)(sVar25 >= sVar55) * sVar25;
      *(ushort *)((long)*palVar9 + 4) =
           (ushort)(sVar26 < sVar56) * sVar56 | (ushort)(sVar26 >= sVar56) * sVar26;
      *(ushort *)((long)*palVar9 + 6) =
           (ushort)(sVar27 < sVar57) * sVar57 | (ushort)(sVar27 >= sVar57) * sVar27;
      *(ushort *)(*palVar9 + 1) =
           (ushort)(sVar28 < sVar58) * sVar58 | (ushort)(sVar28 >= sVar58) * sVar28;
      *(ushort *)((long)*palVar9 + 10) =
           (ushort)(sVar29 < sVar59) * sVar59 | (ushort)(sVar29 >= sVar59) * sVar29;
      *(ushort *)((long)*palVar9 + 0xc) =
           (ushort)(sVar30 < sVar60) * sVar60 | (ushort)(sVar30 >= sVar60) * sVar30;
      *(ushort *)((long)*palVar9 + 0xe) =
           (ushort)(sVar31 < sVar51) * sVar51 | (ushort)(sVar31 >= sVar51) * sVar31;
      auVar17 = auVar19;
    }
  }
  iVar2 = -0x4000;
  while (bVar15 = iVar11 != 0, iVar11 = iVar11 + -1, bVar15) {
    uVar5 = auVar17._0_8_;
    lVar7 = auVar17._8_8_;
    if (iVar2 <= auVar17._14_2_) {
      iVar2 = (int)auVar17._14_2_;
    }
    auVar17._0_8_ = uVar5 << 0x10;
    auVar17._8_8_ = lVar7 << 0x10 | uVar5 >> 0x30;
  }
  ppVar3->score = iVar2;
  ppVar3->flag = ppVar3->flag | 0x8202004;
  local_90 = size;
  local_88 = ppVar3;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar3;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}